

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headers.cpp
# Opt level: O1

header_info *
anon_unknown.dwarf_96c55::sec_websocket_version
          (header_info *__return_storage_ptr__,header_info *hi,string *value)

{
  byte bVar1;
  size_type sVar2;
  bool bVar3;
  undefined8 in_RAX;
  type *ptVar4;
  type tVar5;
  size_type sVar6;
  size_type sVar7;
  maybe<unsigned_int,_void> local_28;
  
  sVar2 = value->_M_string_length;
  if (sVar2 == 0) {
    tVar5 = (type)0x0;
    sVar7 = 0;
  }
  else {
    sVar6 = 0;
    tVar5 = (type)0x0;
    do {
      bVar1 = (value->_M_dataplus)._M_p[sVar6];
      sVar7 = sVar6;
      if ((bVar1 - 0x3a < 0xfffffff6) || (0x1999998f < (uint)tVar5)) break;
      if ((char)bVar1 < '0') {
        pstore::assert_failed
                  ("v[pos] >= \'0\'",
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/http/headers.cpp"
                   ,0x7f);
      }
      tVar5 = (type)(((uint)bVar1 + (int)tVar5 * 10) - 0x30);
      sVar6 = sVar6 + 1;
      sVar7 = sVar2;
    } while (sVar2 != sVar6);
  }
  if (sVar7 == sVar2) {
    local_28._1_7_ = SUB87((ulong)in_RAX >> 8,0);
    local_28.valid_ = true;
    local_28.storage_ = tVar5;
  }
  else {
    local_28.valid_ = false;
    local_28._1_3_ = 0;
    local_28.storage_ = (type)0x0;
  }
  pstore::maybe<unsigned_int,_void>::operator=(&hi->websocket_version,&local_28);
  if (local_28.valid_ == true) {
    local_28 = (maybe<unsigned_int,_void>)((ulong)local_28 & 0xffffffffffffff00);
  }
  bVar3 = hi->connection_upgrade;
  __return_storage_ptr__->upgrade_to_websocket = hi->upgrade_to_websocket;
  __return_storage_ptr__->connection_upgrade = bVar3;
  pstore::
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
  maybe(&__return_storage_ptr__->websocket_key,&hi->websocket_key);
  (__return_storage_ptr__->websocket_version).valid_ = false;
  if ((hi->websocket_version).valid_ == true) {
    ptVar4 = (type *)pstore::maybe<unsigned_int,_void>::operator->(&hi->websocket_version);
    (__return_storage_ptr__->websocket_version).storage_ = *ptVar4;
    (__return_storage_ptr__->websocket_version).valid_ = true;
  }
  return __return_storage_ptr__;
}

Assistant:

header_info sec_websocket_version (header_info hi, std::string const & value) {
        auto str_to_num = [] (std::string const & v) {
            auto pos = std::string::size_type{0};
            auto const last = v.length ();
            auto num = 0U;
            for (; pos < last && std::isdigit (static_cast<unsigned char> (v[pos])); ++pos) {
                if (num > std::numeric_limits<unsigned>::max () / 10U - 10U) {
                    break; // overflow.
                }
                PSTORE_ASSERT (v[pos] >= '0');
                num = num * 10U + static_cast<unsigned> (v[pos] - '0');
            }
            return pos == last ? pstore::just (num) : pstore::nothing<unsigned> ();
        };

        hi.websocket_version = str_to_num (value);
        return hi;
    }